

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedMessageField<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  MapFieldBase *this;
  MapFieldBase *other;
  undefined8 *puVar5;
  undefined8 *puVar6;
  SwapFieldHelper local_30 [16];
  
  if (field->type_ == '\v') {
    bVar4 = FieldDescriptor::is_map_message_type(field);
    if (bVar4) {
      Reflection::VerifyFieldType<google::protobuf::internal::MapFieldBase>(r,field);
      this = (MapFieldBase *)Reflection::MutableRawImpl(r,lhs,field);
      Reflection::VerifyFieldType<google::protobuf::internal::MapFieldBase>(r,field);
      other = (MapFieldBase *)Reflection::MutableRawImpl(r,rhs,field);
      MapFieldBase::InternalSwap(this,other);
      return;
    }
  }
  Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
  puVar5 = (undefined8 *)Reflection::MutableRawImpl(r,lhs,field);
  Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
  puVar6 = (undefined8 *)Reflection::MutableRawImpl(r,rhs,field);
  if (puVar5 != puVar6) {
    uVar1 = *puVar5;
    uVar2 = puVar5[1];
    uVar3 = puVar6[1];
    *puVar5 = *puVar6;
    puVar5[1] = uVar3;
    *puVar6 = uVar1;
    puVar6[1] = uVar2;
    return;
  }
  SwapRepeatedMessageField<true>(local_30);
}

Assistant:

void SwapFieldHelper::SwapRepeatedMessageField(const Reflection* r,
                                               Message* lhs, Message* rhs,
                                               const FieldDescriptor* field) {
  if (IsMapFieldInApi(field)) {
    auto* lhs_map = r->MutableRaw<MapFieldBase>(lhs, field);
    auto* rhs_map = r->MutableRaw<MapFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_map->InternalSwap(rhs_map);
    } else {
      lhs_map->Swap(rhs_map);
    }
  } else {
    auto* lhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
    auto* rhs_rm = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
    if (unsafe_shallow_swap) {
      lhs_rm->InternalSwap(rhs_rm);
    } else {
      lhs_rm->Swap<GenericTypeHandler<Message>>(rhs_rm);
    }
  }
}